

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  ArenaStringPtr *pAVar5;
  bool bVar6;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short sVar7;
  uint32 uVar8;
  uint extraout_EAX;
  FieldOptions *pFVar9;
  pair<int,_int> pVar10;
  ArenaStringPtr *pAVar11;
  UnknownFieldSet *pUVar12;
  int iVar13;
  int iVar14;
  char cVar15;
  uint tag;
  ulong uVar16;
  ArenaStringPtr *local_68;
  ArenaStringPtr *local_60;
  
  this_00 = &this->_internal_metadata_;
  local_68 = &this->name_;
  local_60 = local_68;
  do {
    pbVar2 = input->buffer_;
    uVar8 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar8 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002fdf0a;
      input->buffer_ = pbVar2 + 1;
      uVar16 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002fdf0a:
      uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar16 = 0;
      if (uVar8 - 1 < 0x7f) {
        uVar16 = 0x100000000;
      }
      uVar16 = uVar8 | uVar16;
    }
    tag = (uint)uVar16;
    if ((uVar16 & 0x100000000) == 0) goto switchD_002fdf98_default;
    cVar15 = (char)uVar16;
    switch((uint)(uVar16 >> 3) & 0x1fffffff) {
    case 1:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX_00;
      goto LAB_002fe172;
    case 2:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX_01;
      goto LAB_002fe172;
    case 3:
      if (cVar15 != '\x18') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar16 = (ulong)bVar1;
        uVar8 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_002fe1d6;
        input->buffer_ = pbVar2 + 1;
        bVar6 = true;
      }
      else {
        uVar8 = 0;
LAB_002fe1d6:
        uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        bVar6 = -1 < (long)uVar16;
      }
      iVar14 = 6;
      if (bVar6) {
        this->number_ = (int32)uVar16;
        goto LAB_002fdf6c;
      }
      goto LAB_002fdf6f;
    case 4:
      if (cVar15 == ' ') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          pAVar11 = (ArenaStringPtr *)(ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fe25c;
          input->buffer_ = pbVar2 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002fe25c:
          pAVar11 = (ArenaStringPtr *)io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)pAVar11;
        }
        pAVar5 = local_60;
        if (bVar6 != false) {
          pAVar5 = pAVar11;
        }
        local_60 = (ArenaStringPtr *)((ulong)pAVar5 & 0xffffffff);
        if (bVar6 != false) {
          iVar14 = (int)pAVar5;
          if (iVar14 - 1U < 3) {
            pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
            *pbVar2 = *pbVar2 | 1;
            this->label_ = iVar14;
          }
          else {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar12 = internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_00->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar12 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            iVar13 = 4;
LAB_002fe2ad:
            UnknownFieldSet::AddVarint(pUVar12,iVar13,(long)iVar14);
          }
          goto LAB_002fe2b2;
        }
LAB_002fe2c7:
        iVar14 = 6;
LAB_002fe2b8:
        if (bVar6 != false) goto LAB_002fdf6c;
        goto LAB_002fdf6f;
      }
      break;
    case 5:
      if (cVar15 == '(') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          pAVar11 = (ArenaStringPtr *)(ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002fe1ff;
          input->buffer_ = pbVar2 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002fe1ff:
          pAVar11 = (ArenaStringPtr *)io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)pAVar11;
        }
        pAVar5 = local_68;
        if (bVar6 != false) {
          pAVar5 = pAVar11;
        }
        local_68 = (ArenaStringPtr *)((ulong)pAVar5 & 0xffffffff);
        if (bVar6 == false) goto LAB_002fe2c7;
        iVar14 = (int)pAVar5;
        if (0x11 < iVar14 - 1U) {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar12 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar12 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          iVar13 = 5;
          goto LAB_002fe2ad;
        }
        pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 2;
        this->type_ = iVar14;
LAB_002fe2b2:
        iVar14 = 0;
        goto LAB_002fe2b8;
      }
      break;
    case 6:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX_02;
      goto LAB_002fe172;
    case 7:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX;
LAB_002fe172:
      if (sVar7 == 0) break;
      iVar14 = 6;
      if (sVar7 != 1) goto LAB_002fdf6c;
      goto LAB_002fdf6f;
    case 8:
      if (cVar15 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        if (this->options_ == (FieldOptions *)0x0) {
          pFVar9 = (FieldOptions *)operator_new(0x78);
          FieldOptions::FieldOptions(pFVar9);
          this->options_ = pFVar9;
        }
        pFVar9 = this->options_;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar13 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
          bVar6 = true;
        }
        else {
          iVar13 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar13;
        }
        iVar14 = 6;
        if (((bVar6) &&
            (pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar13),
            -1 < (long)pVar10)) &&
           (bVar6 = FieldOptions::MergePartialFromCodedStream(pFVar9,input), bVar6)) {
          bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
          iVar14 = 6;
          goto LAB_002fe2b8;
        }
        goto LAB_002fdf6f;
      }
      break;
    case 9:
      if (cVar15 != 'H') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar16 = (ulong)bVar1;
        uVar8 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_002fe2d1;
        input->buffer_ = pbVar2 + 1;
        bVar6 = true;
      }
      else {
        uVar8 = 0;
LAB_002fe2d1:
        uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        bVar6 = -1 < (long)uVar16;
      }
      iVar14 = 6;
      if (!bVar6) goto LAB_002fdf6f;
      this->oneof_index_ = (int32)uVar16;
      goto LAB_002fdf6c;
    case 10:
      MergePartialFromCodedStream();
      if ((short)extraout_EAX != 1) {
        if ((extraout_EAX & 0xffff) == 0) break;
        goto LAB_002fdf6c;
      }
      goto LAB_002fe192;
    }
switchD_002fdf98_default:
    iVar14 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        pUVar12 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_00->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar12 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar6 = internal::WireFormat::SkipField(input,tag,pUVar12);
      if (bVar6) {
LAB_002fdf6c:
        iVar14 = 0;
      }
      else {
LAB_002fe192:
        iVar14 = 6;
      }
    }
LAB_002fdf6f:
    if (iVar14 != 0) {
      return iVar14 != 6;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.extendee");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_number();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.type_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.default_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 oneof_index = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_oneof_index();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &oneof_index_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string json_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_json_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->json_name().data(), this->json_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.json_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldDescriptorProto)
  return false;
#undef DO_
}